

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O1

long __thiscall
glcts::anon_unknown_0::CBufferGetPointerv<glcts::(anonymous_namespace)::test_api::GL>::Run
          (CBufferGetPointerv<glcts::(anonymous_namespace)::test_api::GL> *this)

{
  CallLogWrapper *this_00;
  GLboolean GVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *pvVar4;
  long lVar5;
  uint uVar6;
  uint in_R9D;
  uint sizeX;
  void *ptr;
  CDataArray dataRef;
  DIResult result;
  void *pvVar7;
  _func_int **data;
  undefined1 local_4b0 [384];
  undefined1 local_330 [384];
  long local_1b0;
  DILogger local_1a8;
  
  local_330[0] = false;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_330 + 8));
  local_1b0 = 0;
  this_00 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_buffer);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,this->_buffer);
  data = (_func_int **)0x0;
  iVar2 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  uVar6 = 0x4000;
  if ((int)*(uint *)CONCAT44(extraout_var,iVar2) < 0x4000) {
    uVar6 = *(uint *)CONCAT44(extraout_var,iVar2);
  }
  iVar2 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  sizeX = *(uint *)(CONCAT44(extraout_var_00,iVar2) + 4);
  uVar3 = (uint)(0x10000 / (long)(int)uVar6);
  if ((int)uVar3 < (int)sizeX) {
    sizeX = uVar3;
  }
  DrawIndirectBase::DataGen<unsigned_int>
            ((DrawIndirectBase *)&stack0xfffffffffffffb38,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar6,sizeX,0x1e,0x32,
             in_R9D);
  glu::CallLogWrapper::glBufferData(this_00,0x8f3f,-(long)data,data,0x88e8);
  pvVar7 = (void *)0x0;
  glu::CallLogWrapper::glGetBufferPointerv(this_00,0x8f3f,0x88bd,(void **)&stack0xfffffffffffffb30);
  if (pvVar7 != (void *)0x0) {
    local_1b0 = -1;
    local_4b0[0] = (DILogger)0x0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_4b0 + 8));
    if (local_4b0[0] == (DILogger)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_4b0 + 8),
                 "glGetBufferPointerv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_MAP_POINTER) returned invalid pointer, expected: NULL"
                 ,0x6c);
    }
    DILogger::~DILogger((DILogger *)local_4b0);
  }
  pvVar4 = glu::CallLogWrapper::glMapBufferRange(this_00,0x8f3f,0,-(long)data,1);
  if (pvVar4 == (void *)0x0) {
    local_1b0 = -1;
    local_4b0[0] = (DILogger)0x0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_4b0 + 8));
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)local_4b0,
               (char (*) [73])
               "glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, GL_MAP_READ_BIT) returned NULL");
    DILogger::~DILogger((DILogger *)local_4b0);
  }
  else {
    glu::CallLogWrapper::glGetBufferPointerv
              (this_00,0x8f3f,0x88bd,(void **)&stack0xfffffffffffffb30);
    if (pvVar7 == (void *)0x0) {
      local_1b0 = -1;
      local_4b0[0] = (DILogger)0x0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_4b0 + 8));
      if (local_4b0[0] == (DILogger)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_4b0 + 8),
                   "glGetBufferPointerv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_MAP_POINTER) returned NULL"
                   ,0x51);
      }
      DILogger::~DILogger((DILogger *)local_4b0);
    }
    if (pvVar7 != (void *)0x0) {
      lVar5 = DrawIndirectBase::BufferCheck
                        ((DrawIndirectBase *)&stack0xfffffffffffffb38,(CDataArray *)(ulong)uVar6,
                         sizeX,(uint)pvVar7,(void *)(ulong)uVar6,sizeX,0,(uint)pvVar7,(uint)data);
      DIResult::sub_result(&local_1a8,(DIResult *)local_330,lVar5);
      DILogger::~DILogger(&local_1a8);
    }
    if (pvVar7 != pvVar4) {
      local_1b0 = -1;
      local_4b0[0] = (DILogger)0x0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_4b0 + 8));
      if (local_4b0[0] == (DILogger)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_4b0 + 8),
                   "glGetBufferPointerv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_MAP_POINTER) different pointer than glMapBuffer(GL_DRAW_INDIRECT_BUFFER)"
                   ,0x7f);
      }
      DILogger::~DILogger((DILogger *)local_4b0);
    }
    GVar1 = glu::CallLogWrapper::glUnmapBuffer(this_00,0x8f3f);
    if (GVar1 == '\0') {
      local_1b0 = -1;
      local_4b0[0] = (DILogger)0x0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_4b0 + 8));
      if (local_4b0[0] == (DILogger)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_4b0 + 8),
                   "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE",0x4a
                  );
      }
      DILogger::~DILogger((DILogger *)local_4b0);
    }
  }
  lVar5 = local_1b0;
  if (data != (_func_int **)0x0) {
    operator_delete(data,-(long)data);
  }
  DILogger::~DILogger((DILogger *)local_330);
  return lVar5;
}

Assistant:

virtual long Run()
	{
		DIResult result;

		glGenBuffers(1, &_buffer);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _buffer);

		CDataArray dataRef;
		int		   dataWidth, dataHeight;
		getDataSize(dataWidth, dataHeight);
		DataGen<unsigned int>(dataRef, dataWidth, dataHeight, 30, 50);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, (GLsizeiptr)(dataRef.size() * sizeof(unsigned int)), &dataRef[0],
					 GL_DYNAMIC_DRAW);

		void* ptr = 0;
		glGetBufferPointerv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_MAP_POINTER, &ptr);

		if (ptr != 0)
		{
			result.error() << "glGetBufferPointerv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_MAP_POINTER) returned invalid "
							  "pointer, expected: NULL";
		}

		void* buf = glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, 0, (GLsizeiptr)(dataRef.size() * sizeof(unsigned int)),
									 GL_MAP_READ_BIT);
		if (buf == 0)
		{
			result.error() << "glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, GL_MAP_READ_BIT) returned NULL";

			return result.code();
		}

		glGetBufferPointerv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_MAP_POINTER, &ptr);

		if (ptr == 0)
		{
			result.error() << "glGetBufferPointerv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_MAP_POINTER) returned NULL";
		}

		if (ptr)
		{
			result.sub_result(BufferCheck(dataRef, dataWidth, dataHeight, ptr, dataWidth, dataHeight));
		}

		if (ptr != buf)
		{
			result.error() << "glGetBufferPointerv(GL_DRAW_INDIRECT_BUFFER, GL_BUFFER_MAP_POINTER) different pointer "
							  "than glMapBuffer(GL_DRAW_INDIRECT_BUFFER)";
		}

		if (glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) == GL_FALSE)
		{
			result.error() << "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE";
		}
		buf = 0;
		ptr = 0;

		return result.code();
	}